

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_FindValue(ktxHashList *pHead,char *key,uint *pValueLen,void **ppValue)

{
  ktx_error_code_e kVar1;
  ktxHashListEntry *in_RAX;
  void *pvVar2;
  ktxHashListEntry *pEntry;
  ktxHashListEntry *local_18;
  
  kVar1 = KTX_INVALID_VALUE;
  if (ppValue != (void **)0x0 && pValueLen != (uint *)0x0) {
    local_18 = in_RAX;
    kVar1 = ktxHashList_FindEntry(pHead,key,&local_18);
    if (kVar1 == KTX_SUCCESS) {
      *pValueLen = local_18->valueLen;
      kVar1 = KTX_SUCCESS;
      if (local_18->valueLen == 0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = local_18->value;
      }
      *ppValue = pvVar2;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxHashList_FindValue(ktxHashList *pHead, const char* key, unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxHashListEntry* pEntry;
        KTX_error_code result;

        result = ktxHashList_FindEntry(pHead, key, &pEntry);
        if (result == KTX_SUCCESS) {
            ktxHashListEntry_GetValue(pEntry, pValueLen, ppValue);
            return KTX_SUCCESS;
        } else
            return result;
    } else
        return KTX_INVALID_VALUE;
}